

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

ssize_t __thiscall smf::MidiFile::write(MidiFile *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference ppMVar4;
  MidiEvent *pMVar5;
  reference pvVar6;
  size_type sVar7;
  uchar *puVar8;
  undefined8 extraout_RAX;
  undefined4 in_register_00000034;
  ostream *out;
  int local_58;
  int size;
  int k;
  int j;
  int i;
  uchar endoftrack [4];
  vector<unsigned_char,_std::allocator<unsigned_char>_> trackdata;
  ushort shortdata;
  ulong longdata;
  char ch;
  int oldTimeState;
  ostream *out_local;
  MidiFile *this_local;
  
  out = (ostream *)CONCAT44(in_register_00000034,__fd);
  iVar2 = getTickState(this);
  if (iVar2 == 1) {
    makeDeltaTicks(this);
  }
  std::operator<<(out,'M');
  std::operator<<(out,'T');
  std::operator<<(out,'h');
  std::operator<<(out,'d');
  writeBigEndianULong(out,6);
  iVar3 = getNumTracks(this);
  writeBigEndianUShort(out,(ushort)(iVar3 != 1));
  iVar3 = getNumTracks(this);
  writeBigEndianUShort(out,(ushort)iVar3);
  iVar3 = getTicksPerQuarterNote(this);
  writeBigEndianUShort(out,(ushort)iVar3);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
  j = 0x2fff00;
  k = 0;
  do {
    iVar3 = getNumTracks(this);
    if (iVar3 <= k) {
      if (iVar2 == 1) {
        makeAbsoluteTicks(this);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
      return CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,0x1e240);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
    size = 0;
    while( true ) {
      ppMVar4 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                          (&this->m_events,(long)k);
      iVar3 = MidiEventList::size(*ppMVar4);
      if (iVar3 <= size) break;
      ppMVar4 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                          (&this->m_events,(long)k);
      pMVar5 = MidiEventList::operator[](*ppMVar4,size);
      bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar5);
      if (!bVar1) {
        ppMVar4 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                  operator[](&this->m_events,(long)k);
        pMVar5 = MidiEventList::operator[](*ppMVar4,size);
        bVar1 = MidiMessage::isEndOfTrack(&pMVar5->super_MidiMessage);
        if (!bVar1) {
          ppMVar4 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                    operator[](&this->m_events,(long)k);
          pMVar5 = MidiEventList::operator[](*ppMVar4,size);
          writeVLValue(this,(long)pMVar5->tick,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
          ppMVar4 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                    operator[](&this->m_events,(long)k);
          pMVar5 = MidiEventList::operator[](*ppMVar4,size);
          iVar3 = MidiMessage::getCommandByte(&pMVar5->super_MidiMessage);
          if (iVar3 != 0xf0) {
            ppMVar4 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                      operator[](&this->m_events,(long)k);
            pMVar5 = MidiEventList::operator[](*ppMVar4,size);
            iVar3 = MidiMessage::getCommandByte(&pMVar5->super_MidiMessage);
            if (iVar3 != 0xf7) {
              local_58 = 0;
              while( true ) {
                ppMVar4 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                          operator[](&this->m_events,(long)k);
                pMVar5 = MidiEventList::operator[](*ppMVar4,size);
                sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar5);
                if ((int)sVar7 <= local_58) break;
                ppMVar4 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                          operator[](&this->m_events,(long)k);
                pMVar5 = MidiEventList::operator[](*ppMVar4,size);
                pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar5,
                                    (long)local_58);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,pvVar6);
                local_58 = local_58 + 1;
              }
              goto LAB_0013f6f7;
            }
          }
          ppMVar4 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                    operator[](&this->m_events,(long)k);
          pMVar5 = MidiEventList::operator[](*ppMVar4,size);
          pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar5,0);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,pvVar6);
          ppMVar4 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                    operator[](&this->m_events,(long)k);
          pMVar5 = MidiEventList::operator[](*ppMVar4,size);
          sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar5);
          writeVLValue(this,(long)((int)sVar7 + -1),
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
          local_58 = 1;
          while( true ) {
            ppMVar4 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                      operator[](&this->m_events,(long)k);
            pMVar5 = MidiEventList::operator[](*ppMVar4,size);
            sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar5);
            if ((int)sVar7 <= local_58) break;
            ppMVar4 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                      operator[](&this->m_events,(long)k);
            pMVar5 = MidiEventList::operator[](*ppMVar4,size);
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar5,
                                (long)local_58);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,pvVar6);
            local_58 = local_58 + 1;
          }
        }
      }
LAB_0013f6f7:
      size = size + 1;
    }
    sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
    iVar3 = (int)sVar7;
    if (((iVar3 < 3) ||
        (pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,
                             (long)(iVar3 + -3)), *pvVar6 != 0xff)) ||
       (pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,
                            (long)(iVar3 + -2)), *pvVar6 != '/')) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,
                 (value_type_conflict2 *)&j);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,
                 (value_type_conflict2 *)((long)&j + 1));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,
                 (value_type_conflict2 *)((long)&j + 2));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,
                 (value_type_conflict2 *)((long)&j + 3));
    }
    std::operator<<(out,'M');
    std::operator<<(out,'T');
    std::operator<<(out,'r');
    std::operator<<(out,'k');
    sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
    writeBigEndianULong(out,(long)(int)sVar7);
    puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
    std::ostream::write((char *)out,(long)puVar8);
    k = k + 1;
  } while( true );
}

Assistant:

bool MidiFile::write(std::ostream& out) {
	int oldTimeState = getTickState();
	if (oldTimeState == TIME_STATE_ABSOLUTE) {
		makeDeltaTicks();
	}

	// write the header of the Standard MIDI File
	char ch;
	// 1. The characters "MThd"
	ch = 'M'; out << ch;
	ch = 'T'; out << ch;
	ch = 'h'; out << ch;
	ch = 'd'; out << ch;

	// 2. write the size of the header (always a "6" stored in unsigned long
	//    (4 bytes).
	ulong longdata = 6;
	writeBigEndianULong(out, longdata);

	// 3. MIDI file format, type 0, 1, or 2
	ushort shortdata;
	shortdata = static_cast<ushort>(getNumTracks() == 1 ? 0 : 1);
	writeBigEndianUShort(out,shortdata);

	// 4. write out the number of tracks.
	shortdata = static_cast<ushort>(getNumTracks());
	writeBigEndianUShort(out, shortdata);

	// 5. write out the number of ticks per quarternote. (avoiding SMPTE for now)
	shortdata = static_cast<ushort>(getTicksPerQuarterNote());
	writeBigEndianUShort(out, shortdata);

	// now write each track.
	std::vector<uchar> trackdata;
	uchar endoftrack[4] = {0, 0xff, 0x2f, 0x00};
	int i, j, k;
	int size;
	for (i=0; i<getNumTracks(); i++) {
		trackdata.reserve(123456);   // make the track data larger than
		                             // expected data input
		trackdata.clear();
		for (j=0; j<(int)m_events[i]->size(); j++) {
			if ((*m_events[i])[j].empty()) {
				// Don't write empty m_events (probably a delete message).
				continue;
			}
			if ((*m_events[i])[j].isEndOfTrack()) {
				// Suppress end-of-track meta messages (one will be added
				// automatically after all track data has been written).
				continue;
			}
			writeVLValue((*m_events[i])[j].tick, trackdata);
			if (((*m_events[i])[j].getCommandByte() == 0xf0) ||
					((*m_events[i])[j].getCommandByte() == 0xf7)) {
				// 0xf0 == Complete sysex message (0xf0 is part of the raw MIDI).
				// 0xf7 == Raw byte message (0xf7 not part of the raw MIDI).
				// Print the first byte of the message (0xf0 or 0xf7), then
				// print a VLV length for the rest of the bytes in the message.
				// In other words, when creating a 0xf0 or 0xf7 MIDI message,
				// do not insert the VLV byte length yourself, as this code will
				// do it for you automatically.
				trackdata.push_back((*m_events[i])[j][0]); // 0xf0 or 0xf7;
				writeVLValue(((int)(*m_events[i])[j].size())-1, trackdata);
				for (k=1; k<(int)(*m_events[i])[j].size(); k++) {
					trackdata.push_back((*m_events[i])[j][k]);
				}
			} else {
				// non-sysex type of message, so just output the
				// bytes of the message:
				for (k=0; k<(int)(*m_events[i])[j].size(); k++) {
					trackdata.push_back((*m_events[i])[j][k]);
				}
			}
		}
		size = (int)trackdata.size();
		if ((size < 3) || !((trackdata[size-3] == 0xff)
				&& (trackdata[size-2] == 0x2f))) {
			trackdata.push_back(endoftrack[0]);
			trackdata.push_back(endoftrack[1]);
			trackdata.push_back(endoftrack[2]);
			trackdata.push_back(endoftrack[3]);
		}

		// now ready to write to MIDI file.

		// first write the track ID marker "MTrk":
		ch = 'M'; out << ch;
		ch = 'T'; out << ch;
		ch = 'r'; out << ch;
		ch = 'k'; out << ch;

		// A. write the size of the MIDI data to follow:
		longdata = (int)trackdata.size();
		writeBigEndianULong(out, longdata);

		// B. write the actual data
		out.write((char*)trackdata.data(), trackdata.size());
	}

	if (oldTimeState == TIME_STATE_ABSOLUTE) {
		makeAbsoluteTicks();
	}

	return true;
}